

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O3

int raviX_ptrlist_replace(PtrList **self,void *old_ptr,void *new_ptr,int count)

{
  void *pvVar1;
  PtrListIterator iter;
  PtrListIterator local_38;
  
  local_38.__head = *self;
  local_38.__nr = -1;
  local_38.__list = local_38.__head;
  pvVar1 = raviX_ptrlist_iter_next(&local_38);
  do {
    if (pvVar1 == (void *)0x0) {
      if (count < 1) {
        return count;
      }
      __assert_fail("count <= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                    ,0x152,"int raviX_ptrlist_replace(PtrList **, void *, void *, int)");
    }
    if (pvVar1 == old_ptr) {
      raviX_ptrlist_iter_set(&local_38,new_ptr);
      count = count + -1;
      if (count == 0) {
        return 0;
      }
    }
    pvVar1 = raviX_ptrlist_iter_next(&local_38);
  } while( true );
}

Assistant:

int raviX_ptrlist_replace(PtrList **self, void *old_ptr, void *new_ptr, int count)
{
	PtrListIterator iter = raviX_ptrlist_forward_iterator(*self);
	for (void *ptr = raviX_ptrlist_iter_next(&iter); ptr != NULL; ptr = raviX_ptrlist_iter_next(&iter)) {
		if (ptr == old_ptr) {
			raviX_ptrlist_iter_set(&iter, new_ptr);
			if (!--count)
				goto out;
		}
	}
	assert(count <= 0);
out:
	return count;
}